

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>
::rebalance_left_to_right
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>
           *this,int to_move,
          btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>
          *right,allocator_type *alloc)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  field_type fVar4;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>
  *pbVar5;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>
  *pbVar6;
  template_ElementType<2UL> *ptVar7;
  template_ElementType<2UL> *ptVar8;
  slot_type *result;
  BaseCountedInstance *pBVar9;
  template_ElementType<1UL> *ptVar10;
  template_ElementType<3UL> *ppbVar11;
  uint uVar12;
  int iVar13;
  BaseCountedInstance *this_00;
  slot_type *last;
  int iVar14;
  size_type n;
  BaseCountedInstance *x;
  ulong local_40;
  template_ElementType<2UL> *local_38;
  
  pbVar5 = parent(this);
  pbVar6 = parent(right);
  if (pbVar5 != pbVar6) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ab,
                  "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 64, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 64, false>]"
                 );
  }
  bVar1 = position(this);
  bVar2 = position(right);
  if (bVar1 + 1 != (uint)bVar2) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ac,
                  "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 64, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 64, false>]"
                 );
  }
  bVar1 = count(this);
  bVar2 = count(right);
  if (bVar1 < bVar2) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ad,
                  "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 64, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 64, false>]"
                 );
  }
  if (0 < to_move) {
    bVar1 = count(this);
    if ((uint)to_move <= (uint)bVar1) {
      bVar1 = count(right);
      if ((uint)bVar1 < (uint)to_move) {
        bVar1 = count(right);
        uninitialized_move_n(right,(ulong)bVar1,0,(ulong)(uint)to_move,right,alloc);
        pbVar5 = parent(this);
        bVar1 = position(this);
        local_38 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                   ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                    *)pbVar5);
        local_38 = local_38 + bVar1;
        btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
        ::value_init<phmap::test_internal::MovableOnlyInstance*>
                  ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                    *)right,(ulong)(to_move - 1U),alloc,&local_38);
        bVar1 = count(right);
        n = (size_type)(int)(~(uint)bVar1 + to_move);
        bVar1 = count(this);
        bVar2 = count(right);
        uninitialized_move_n(this,n,bVar1 - n,(ulong)bVar2,right,alloc);
        bVar1 = count(this);
        ptVar7 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                  *)this);
        ptVar7 = ptVar7 + (int)((uint)bVar1 - (to_move - 1U));
        bVar1 = count(this);
        ptVar8 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                  *)this);
        last = ptVar8 + (bVar1 - n);
        result = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                  *)right);
      }
      else {
        bVar1 = count(right);
        bVar2 = count(right);
        uninitialized_move_n
                  (right,(ulong)(uint)to_move,(long)(int)((uint)bVar1 - to_move),(ulong)bVar2,right,
                   alloc);
        bVar1 = count(right);
        if ((uint)to_move < (uint)bVar1) {
          bVar1 = count(right);
          ptVar7 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                   ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                    *)right);
          bVar2 = count(right);
          ptVar8 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                   ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                    *)right);
          pBVar9 = &btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                    ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                     *)right)->super_BaseCountedInstance;
          this_00 = &ptVar8[bVar2].super_BaseCountedInstance;
          for (x = &ptVar7[(int)(~to_move + (uint)bVar1)].super_BaseCountedInstance;
              this_00 = this_00 + -1, pBVar9 <= x; x = x + -1) {
            test_internal::BaseCountedInstance::operator=(this_00,x);
          }
        }
        pbVar5 = parent(this);
        bVar1 = position(this);
        ptVar7 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                  *)pbVar5);
        ptVar8 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                  *)right);
        test_internal::BaseCountedInstance::operator=
                  (&ptVar8[to_move - 1U].super_BaseCountedInstance,
                   &ptVar7[bVar1].super_BaseCountedInstance);
        bVar1 = count(this);
        ptVar7 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                  *)this);
        ptVar7 = ptVar7 + (int)((uint)bVar1 - (to_move - 1U));
        bVar1 = count(this);
        ptVar8 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                  *)this);
        last = ptVar8 + bVar1;
        result = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                  *)right);
      }
      local_40 = (ulong)(uint)to_move;
      set_slot_policy<phmap::test_internal::MovableOnlyInstance>::
      move<std::allocator<phmap::test_internal::MovableOnlyInstance>>(alloc,ptVar7,last,result);
      bVar1 = count(this);
      ptVar7 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
               ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                *)this);
      pbVar5 = parent(this);
      bVar2 = position(this);
      ptVar8 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
               ::GetField<2ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                *)pbVar5);
      test_internal::BaseCountedInstance::operator=
                (&ptVar8[bVar2].super_BaseCountedInstance,
                 &ptVar7[(int)((uint)bVar1 - to_move)].super_BaseCountedInstance);
      bVar1 = count(this);
      value_destroy_n(this,(long)(int)((uint)bVar1 - to_move),local_40,alloc);
      bVar3 = leaf(this);
      if (!bVar3) {
        bVar1 = count(right);
        for (uVar12 = (uint)bVar1; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
          ppbVar11 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                     ::GetField<3ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                      *)right);
          init_child(right,to_move + uVar12,ppbVar11[uVar12]);
          btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
          ::GetField<3ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                           *)right);
        }
        iVar13 = 1;
        iVar14 = -to_move;
        while (iVar14 = iVar14 + 1, iVar14 != 1) {
          bVar1 = count(this);
          ppbVar11 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                     ::GetField<3ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                      *)this);
          init_child(right,iVar13 + -1,ppbVar11[(int)((uint)bVar1 + iVar14)]);
          count(this);
          btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
          ::GetField<3ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                           *)this);
          iVar13 = iVar13 + 1;
        }
      }
      fVar4 = count(this);
      ptVar10 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                ::GetField<1ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                 *)this);
      ptVar10[2] = fVar4 - (char)to_move;
      fVar4 = count(right);
      ptVar10 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                ::GetField<1ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
                                 *)right);
      ptVar10[2] = fVar4 + (char)to_move;
      return;
    }
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8af,
                  "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 64, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 64, false>]"
                 );
  }
  __assert_fail("to_move >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x8ae,
                "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 64, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 64, false>]"
               );
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                                btree_node *right,
                                                allocator_type *alloc) {
        assert(parent() == right->parent());
        assert(position() + 1 == right->position());
        assert(count() >= right->count());
        assert(to_move >= 1);
        assert(to_move <= count());

        // Values in the right node are shifted to the right to make room for the
        // new to_move values. Then, the delimiting value in the parent and the
        // other (to_move - 1) values in the left node are moved into the right node.
        // Lastly, a new delimiting value is moved from the left node into the
        // parent, and the remaining empty left node entries are destroyed.

        if (right->count() >= to_move) {
            // The original location of the right->count() values are sufficient to hold
            // the new to_move entries from the parent and left node.

            // 1) Shift existing values in the right node to their correct positions.
            right->uninitialized_move_n(to_move, right->count() - to_move,
                                        right->count(), right, alloc);
            if (right->count() > to_move) {
                for (slot_type *src = right->slot(right->count() - to_move - 1),
                         *dest = right->slot(right->count() - 1),
                         *end = right->slot(0);
                     src >= end; --src, --dest) {
                    params_type::move(alloc, src, dest);
                }
            }

            // 2) Move the delimiting value in the parent to the right node.
            params_type::move(alloc, parent()->slot(position()),
                              right->slot(to_move - 1));

            // 3) Move the (to_move - 1) values from the left node to the right node.
            params_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                              right->slot(0));
        } else {
            // The right node does not have enough initialized space to hold the new
            // to_move entries, so part of them will move to uninitialized space.

            // 1) Shift existing values in the right node to their correct positions.
            right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

            // 2) Move the delimiting value in the parent to the right node.
            right->value_init(to_move - 1, alloc, parent()->slot(position()));

            // 3) Move the (to_move - 1) values from the left node to the right node.
            const size_type uninitialized_remaining = to_move - right->count() - 1;
            uninitialized_move_n(uninitialized_remaining,
                                 count() - uninitialized_remaining, right->count(),
                                 right, alloc);
            params_type::move(alloc, slot(count() - (to_move - 1)),
                              slot(count() - uninitialized_remaining), right->slot(0));
        }

        // 4) Move the new delimiting value to the parent from the left node.
        params_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

        // 5) Destroy the now-empty to_move entries in the left node.
        value_destroy_n(count() - to_move, to_move, alloc);

        if (!leaf()) {
            // Move the child pointers from the left to the right node.
            for (int i = right->count(); i >= 0; --i) {
                right->init_child(i + to_move, right->child(i));
                right->clear_child(i);
            }
            for (int i = 1; i <= to_move; ++i) {
                right->init_child(i - 1, child(count() - to_move + i));
                clear_child(count() - to_move + i);
            }
        }

        // Fixup the counts on the left and right nodes.
        set_count((field_type)(count() - to_move));
        right->set_count((field_type)(right->count() + to_move));
    }